

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize.c
# Opt level: O3

void av1_set_quantizer(AV1_COMMON *cm,int min_qmlevel,int max_qmlevel,int q,int enable_chroma_deltaq
                      ,int enable_hdr_deltaq,_Bool is_allintra,aom_tune_metric tuning)

{
  SequenceHeader *pSVar1;
  code *pcVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  code *pcVar9;
  bool bVar10;
  undefined8 uVar11;
  double dVar12;
  double dVar13;
  undefined8 uVar14;
  
  uVar5 = (cm->delta_q_info).delta_q_present_flag;
  uVar3 = (ulong)(uint)q;
  if (q < (int)uVar5) {
    uVar3 = (ulong)uVar5;
  }
  iVar8 = (int)uVar3;
  (cm->quant_params).base_qindex = iVar8;
  (cm->quant_params).y_dc_delta_q = 0;
  if (enable_chroma_deltaq == 0) {
    uVar11 = 0;
    uVar14 = 0;
  }
  else {
    if (is_allintra && (tuning & ~AOM_TUNE_SSIM) == AOM_TUNE_IQ) {
      pSVar1 = cm->seq_params;
      iVar6 = 0;
      if (pSVar1->subsampling_x == 0) {
        iVar4 = 0;
        if (pSVar1->subsampling_y == 0) {
          iVar7 = (int)(uVar3 >> 0x1f) + iVar8 >> 1;
          bVar10 = SBORROW4(iVar7,0x18);
          iVar4 = iVar7 + -0x18;
          iVar6 = 0x18;
LAB_0018e124:
          if (bVar10 != iVar4 < 0) {
            iVar6 = iVar7;
          }
          iVar4 = 0;
          if (iVar6 < 1) {
            iVar4 = 0;
            iVar6 = 0;
          }
        }
      }
      else {
        iVar6 = 0;
        if (pSVar1->subsampling_x == 1) {
          if (pSVar1->subsampling_y == 0) {
            iVar7 = (int)(uVar3 >> 0x1f) + iVar8 >> 1;
            bVar10 = SBORROW4(iVar7,6);
            iVar4 = iVar7 + -6;
            iVar6 = 6;
            goto LAB_0018e124;
          }
          iVar4 = 0;
          if (pSVar1->subsampling_y == 1) {
            iVar4 = (int)(uVar3 >> 0x1f) + iVar8 >> 1;
            iVar6 = 0x1e;
            if (iVar4 < 0x1e) {
              iVar6 = iVar4;
            }
            if (iVar6 < 0xf) {
              iVar6 = 0xe;
            }
            iVar4 = 0xe - iVar6;
            iVar6 = 0xe - iVar6;
          }
        }
        else {
          iVar4 = 0;
        }
      }
      (cm->quant_params).u_dc_delta_q = iVar4;
      (cm->quant_params).u_ac_delta_q = iVar6;
      (cm->quant_params).v_dc_delta_q = iVar4;
      (cm->quant_params).v_ac_delta_q = iVar6;
      goto LAB_0018e146;
    }
    uVar11 = 0x200000002;
    uVar14 = 0x200000002;
  }
  (cm->quant_params).u_dc_delta_q = (int)uVar11;
  (cm->quant_params).v_dc_delta_q = (int)((ulong)uVar11 >> 0x20);
  (cm->quant_params).u_ac_delta_q = (int)uVar14;
  (cm->quant_params).v_ac_delta_q = (int)((ulong)uVar14 >> 0x20);
LAB_0018e146:
  if (enable_hdr_deltaq != 0) {
    dVar12 = ((double)iVar8 * 0.5 * -0.46 + 9.26) * 1.04;
    dVar12 = dVar12 + dVar12;
    uVar5 = (uint)(dVar12 + *(double *)(&DAT_004d1500 + (ulong)(dVar12 < 0.0) * 8));
    iVar8 = -0x18;
    if (-0x19 < (int)uVar5) {
      dVar13 = (double)(int)((int)uVar5 >> 0x1f & uVar5);
      dVar12 = 24.0;
      if (dVar13 <= 24.0) {
        dVar12 = dVar13;
      }
      iVar8 = (int)dVar12;
    }
    (cm->quant_params).u_dc_delta_q = iVar8;
    (cm->quant_params).v_dc_delta_q = iVar8;
    (cm->quant_params).u_ac_delta_q = iVar8;
    (cm->quant_params).v_ac_delta_q = iVar8;
  }
  if (is_allintra) {
    if ((tuning & ~AOM_TUNE_SSIM) == AOM_TUNE_IQ) {
      pcVar2 = aom_get_qmlevel_luma_ssimulacra2;
      if (tuning != AOM_TUNE_SSIMULACRA2) {
        pcVar2 = aom_get_qmlevel_allintra;
      }
      pcVar9 = aom_get_qmlevel_allintra;
      if ((cm->seq_params->subsampling_x == 0) && (cm->seq_params->subsampling_y == 0)) {
        pcVar9 = aom_get_qmlevel_444_chroma;
      }
    }
    else {
      pcVar2 = aom_get_qmlevel_allintra;
      pcVar9 = pcVar2;
    }
  }
  else {
    pcVar2 = aom_get_qmlevel;
    pcVar9 = pcVar2;
  }
  iVar8 = (*pcVar2)(uVar3,min_qmlevel,max_qmlevel);
  (cm->quant_params).qmatrix_level_y = iVar8;
  iVar8 = (*pcVar9)((cm->quant_params).u_ac_delta_q + (cm->quant_params).base_qindex,min_qmlevel,
                    max_qmlevel);
  (cm->quant_params).qmatrix_level_u = iVar8;
  if (cm->seq_params->separate_uv_delta_q != '\0') {
    iVar8 = (*pcVar9)((cm->quant_params).v_ac_delta_q + (cm->quant_params).base_qindex,min_qmlevel,
                      max_qmlevel);
  }
  (cm->quant_params).qmatrix_level_v = iVar8;
  return;
}

Assistant:

void av1_set_quantizer(AV1_COMMON *const cm, int min_qmlevel, int max_qmlevel,
                       int q, int enable_chroma_deltaq, int enable_hdr_deltaq,
                       bool is_allintra, aom_tune_metric tuning) {
  // quantizer has to be reinitialized with av1_init_quantizer() if any
  // delta_q changes.
  CommonQuantParams *quant_params = &cm->quant_params;
  quant_params->base_qindex = AOMMAX(cm->delta_q_info.delta_q_present_flag, q);
  quant_params->y_dc_delta_q = 0;

  if (enable_chroma_deltaq) {
    if (is_allintra &&
        (tuning == AOM_TUNE_IQ || tuning == AOM_TUNE_SSIMULACRA2)) {
      int chroma_dc_delta_q = 0;
      int chroma_ac_delta_q = 0;

      if (cm->seq_params->subsampling_x == 1 &&
          cm->seq_params->subsampling_y == 1) {
        // 4:2:0 subsampling: Constant chroma delta_q decrease (i.e. improved
        // chroma quality relative to luma) with gradual ramp-down for very low
        // qindexes.
        // Lowering chroma delta_q by 16 was found to improve SSIMULACRA 2
        // BD-Rate by 1.5-2% on Daala's subset1, as well as reducing chroma
        // artifacts (smudging, discoloration) during subjective quality
        // evaluations.
        // The ramp-down of chroma increase was determined by generating the
        // convex hull of SSIMULACRA 2 scores (for all boosts from 0-16), and
        // finding a linear equation that fits the convex hull.
        chroma_dc_delta_q = -clamp((quant_params->base_qindex / 2) - 14, 0, 16);
        chroma_ac_delta_q = chroma_dc_delta_q;
      } else if (cm->seq_params->subsampling_x == 1 &&
                 cm->seq_params->subsampling_y == 0) {
        // 4:2:2 subsampling: Constant chroma AC delta_q increase (i.e. improved
        // luma quality relative to chroma) with gradual ramp-down for very low
        // qindexes.
        // SSIMULACRA 2 appears to have some issues correctly scoring 4:2:2
        // material. Solely optimizing for maximum scores suggests a chroma AC
        // delta_q of 12 is the most efficient. However, visual inspection on
        // difficult-to-encode material resulted in chroma quality degrading too
        // much relative to luma, and chroma channels ending up being too small
        // compared to equivalent 4:4:4 or 4:2:0 encodes.
        // A chroma AC delta_q of 6 was selected because encoded chroma channels
        // have a much closer size to 4:4:4 and 4:2:0 encodes, and have more
        // favorable visual quality characteristics.
        // The ramp-down of chroma decrease was put into place to match 4:2:0
        // and 4:4:4 behavior. There were no special considerations on
        // SSIMULACRA 2 scores.
        chroma_dc_delta_q = 0;
        chroma_ac_delta_q = clamp((quant_params->base_qindex / 2), 0, 6);
      } else if (cm->seq_params->subsampling_x == 0 &&
                 cm->seq_params->subsampling_y == 0) {
        // 4:4:4 subsampling: Constant chroma AC delta_q increase (i.e. improved
        // luma quality relative to chroma) with gradual ramp-down for very low
        // qindexes.
        // Raising chroma AC delta_q by 24 was found to improve SSIMULACRA 2
        // BD-Rate by 2.5-3% on Daala's subset1, as well as providing a more
        // balanced bit allocation between the (relatively-starved) luma and
        // chroma channels.
        // Raising chroma DC delta_q appears to be harmful, both for SSIMULACRA
        // 2 scores and subjective quality (harshens blocking artifacts).
        // The ramp-down of chroma decrease was put into place so (lossy) QP 0
        // encodes still score within 0.1 SSIMULACRA 2 points of the equivalent
        // with no chroma delta_q (with a small efficiency improvement), while
        // encodes in the SSIMULACRA 2 <=90 range yield full benefits from this
        // adjustment.
        chroma_dc_delta_q = 0;
        chroma_ac_delta_q = clamp((quant_params->base_qindex / 2), 0, 24);
      }

      // TODO: bug https://crbug.com/aomedia/375221136 - find chroma_delta_q
      // values for 4:2:2 subsampling mode.
      quant_params->u_dc_delta_q = chroma_dc_delta_q;
      quant_params->u_ac_delta_q = chroma_ac_delta_q;
      quant_params->v_dc_delta_q = chroma_dc_delta_q;
      quant_params->v_ac_delta_q = chroma_ac_delta_q;
    } else {
      // TODO(aomedia:2717): need to design better delta
      quant_params->u_dc_delta_q = 2;
      quant_params->u_ac_delta_q = 2;
      quant_params->v_dc_delta_q = 2;
      quant_params->v_ac_delta_q = 2;
    }
  } else {
    quant_params->u_dc_delta_q = 0;
    quant_params->u_ac_delta_q = 0;
    quant_params->v_dc_delta_q = 0;
    quant_params->v_ac_delta_q = 0;
  }

  // following section 8.3.2 in T-REC-H.Sup15 document
  // to apply to AV1 qindex in the range of [0, 255]
  if (enable_hdr_deltaq) {
    int dqpCb = adjust_hdr_cb_deltaq(quant_params->base_qindex);
    int dqpCr = adjust_hdr_cr_deltaq(quant_params->base_qindex);
    quant_params->u_dc_delta_q = quant_params->u_ac_delta_q = dqpCb;
    quant_params->v_dc_delta_q = quant_params->v_ac_delta_q = dqpCr;
    if (dqpCb != dqpCr) {
      cm->seq_params->separate_uv_delta_q = 1;
    }
  }

  // Select the best luma and chroma QM formulas based on encoding mode and
  // tuning
  int (*get_luma_qmlevel)(int, int, int);
  int (*get_chroma_qmlevel)(int, int, int);

  if (is_allintra) {
    if (tuning == AOM_TUNE_IQ || tuning == AOM_TUNE_SSIMULACRA2) {
      if (tuning == AOM_TUNE_SSIMULACRA2) {
        // Use luma QM formula specifically tailored for tune SSIMULACRA2
        get_luma_qmlevel = aom_get_qmlevel_luma_ssimulacra2;
      } else {
        get_luma_qmlevel = aom_get_qmlevel_allintra;
      }

      if (cm->seq_params->subsampling_x == 0 &&
          cm->seq_params->subsampling_y == 0) {
        // 4:4:4 subsampling mode has 4x the number of chroma coefficients
        // compared to 4:2:0 (2x on each dimension). This means the encoder
        // should use lower chroma QM levels that more closely match the scaling
        // of an equivalent 4:2:0 chroma QM.
        get_chroma_qmlevel = aom_get_qmlevel_444_chroma;
      } else {
        // For all other chroma subsampling modes, use the all intra QM formula
        get_chroma_qmlevel = aom_get_qmlevel_allintra;
      }
    } else {
      get_luma_qmlevel = aom_get_qmlevel_allintra;
      get_chroma_qmlevel = aom_get_qmlevel_allintra;
    }
  } else {
    get_luma_qmlevel = aom_get_qmlevel;
    get_chroma_qmlevel = aom_get_qmlevel;
  }

  quant_params->qmatrix_level_y =
      get_luma_qmlevel(quant_params->base_qindex, min_qmlevel, max_qmlevel);
  quant_params->qmatrix_level_u =
      get_chroma_qmlevel(quant_params->base_qindex + quant_params->u_ac_delta_q,
                         min_qmlevel, max_qmlevel);

  if (cm->seq_params->separate_uv_delta_q) {
    quant_params->qmatrix_level_v = get_chroma_qmlevel(
        quant_params->base_qindex + quant_params->v_ac_delta_q, min_qmlevel,
        max_qmlevel);
  } else {
    quant_params->qmatrix_level_v = quant_params->qmatrix_level_u;
  }
}